

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall sznet::TimerQueue::~TimerQueue(TimerQueue *this)

{
  MinHeap<sznet::Timer> *this_00;
  _Manager_type p_Var1;
  Timer *pTVar2;
  
  if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (ulong)(this->m_timerMinHeap).m_size) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x28,"sznet::TimerQueue::~TimerQueue()");
  }
  this_00 = &this->m_timerMinHeap;
  do {
    pTVar2 = MinHeap<sznet::Timer>::pop(this_00);
    if (pTVar2 == (Timer *)0x0) break;
    p_Var1 = (pTVar2->m_callback).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&pTVar2->m_callback,(_Any_data *)&pTVar2->m_callback,__destroy_functor)
      ;
    }
    operator_delete(pTVar2);
  } while (pTVar2 != (Timer *)0x0);
  std::
  _Rb_tree<std::pair<sznet::Timer_*,_long>,_std::pair<sznet::Timer_*,_long>,_std::_Identity<std::pair<sznet::Timer_*,_long>_>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
  ::clear(&(this->m_activeTimers)._M_t);
  if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (ulong)(this->m_timerMinHeap).m_size) {
    std::
    _Rb_tree<std::pair<sznet::Timer_*,_long>,_std::pair<sznet::Timer_*,_long>,_std::_Identity<std::pair<sznet::Timer_*,_long>_>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
    ::~_Rb_tree(&(this->m_activeTimers)._M_t);
    if (this_00->m_ptrArr != (Timer **)0x0) {
      free(this_00->m_ptrArr);
      this_00->m_ptrArr = (Timer **)0x0;
    }
    return;
  }
  __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                ,0x34,"sznet::TimerQueue::~TimerQueue()");
}

Assistant:

TimerQueue::~TimerQueue()
{
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	while (true)
	{
		Timer* timer = m_timerMinHeap.pop();
		if (!timer)
		{
			break;
		}
		delete timer;
		timer = nullptr;
	}
	m_activeTimers.clear();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}